

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O2

void __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::init_config_database(RuntimeConfigImpl *this)

{
  config_profile_t *this_00;
  RuntimeConfigImpl *this_01;
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  ConfigSetImpl *__p;
  iterator iVar4;
  ostream *poVar5;
  long lVar6;
  string *profile_name;
  pointer __k;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined1 local_118 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108 [2];
  RuntimeConfigImpl *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  profile_names;
  shared_ptr<cali::ConfigSetImpl> config_cfg;
  config_entry_list_t configdata;
  ConfigSetImpl init_config_cfg;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[8],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&init_config_cfg,(char (*) [8])0x23b42f,(char (*) [8])"default");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[15],_true>
            (&local_70,(char (*) [5])0x2320f4,(char (*) [15])"caliper.config");
  __l._M_len = 2;
  __l._M_array = (iterator)&init_config_cfg;
  local_f8 = this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&configdata,__l,(allocator_type *)local_118);
  lVar6 = 0x40;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&init_config_cfg.m_dict._M_h._M_buckets + lVar6));
    this_01 = local_f8;
    lVar6 = lVar6 + -0x40;
  } while (lVar6 != -0x40);
  init_config_cfg.m_dict._M_h._M_buckets = &init_config_cfg.m_dict._M_h._M_single_bucket;
  init_config_cfg.m_dict._M_h._M_bucket_count = 1;
  init_config_cfg.m_dict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  init_config_cfg.m_dict._M_h._M_element_count = 0;
  init_config_cfg.m_dict._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  init_config_cfg.m_dict._M_h._M_rehash_policy._M_next_resize = 0;
  init_config_cfg.m_dict._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &local_f8->m_combined_profile;
  ConfigSetImpl::init(&init_config_cfg,(EVP_PKEY_CTX *)0x232361);
  ConfigSetImpl::get((StringConverter *)local_118,&init_config_cfg,"file");
  StringConverter::to_stringlist_abi_cxx11_
            (&profile_names,(StringConverter *)local_118,",",(bool *)0x0);
  read_config_files(this_01,&profile_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&profile_names);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"default",(allocator<char> *)&profile_names);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator[](&this_01->m_config_profiles,(key_type *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  for (p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)(p_Var3 + 1));
    std::__cxx11::string::_M_assign((string *)pmVar2);
  }
  __p = (ConfigSetImpl *)operator_new(0x38);
  (__p->m_dict)._M_h._M_buckets = &(__p->m_dict)._M_h._M_single_bucket;
  (__p->m_dict)._M_h._M_bucket_count = 1;
  (__p->m_dict)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->m_dict)._M_h._M_element_count = 0;
  (__p->m_dict)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__p->m_dict)._M_h._M_rehash_policy._M_next_resize = 0;
  (__p->m_dict)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__shared_ptr<cali::ConfigSetImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cali::ConfigSetImpl,void>
            ((__shared_ptr<cali::ConfigSetImpl,(__gnu_cxx::_Lock_policy)2> *)&config_cfg,__p);
  ConfigSetImpl::init(config_cfg.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(EVP_PKEY_CTX *)0x232361);
  local_118._0_8_ = "config";
  std::__shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
             &config_cfg.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
  ::_M_emplace_unique<std::pair<char_const*,std::shared_ptr<cali::ConfigSetImpl>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
              *)&this_01->m_database,
             (pair<const_char_*,_std::shared_ptr<cali::ConfigSetImpl>_> *)local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_108);
  ConfigSetImpl::get((StringConverter *)local_118,
                     config_cfg.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,"profile");
  StringConverter::to_stringlist_abi_cxx11_
            (&profile_names,(StringConverter *)local_118,",",(bool *)0x0);
  std::__cxx11::string::~string((string *)local_118);
  local_f8 = (RuntimeConfigImpl *)&(local_f8->m_config_profiles)._M_t._M_impl.super__Rb_tree_header;
  for (__k = profile_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != profile_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::find(&(this_01->m_config_profiles)._M_t,__k);
    if ((RuntimeConfigImpl *)iVar4._M_node == local_f8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"caliper: error: config profile \"");
      poVar5 = std::operator<<(poVar5,(string *)__k);
      poVar5 = std::operator<<(poVar5,"\" not defined.");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      for (p_Var3 = iVar4._M_node[2]._M_right; p_Var3 != (_Base_ptr)&iVar4._M_node[2]._M_parent;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,(key_type *)(p_Var3 + 1));
        std::__cxx11::string::_M_assign((string *)pmVar2);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&profile_names);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&config_cfg.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&init_config_cfg);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&configdata);
  return;
}

Assistant:

void init_config_database()
    {
        const config_entry_list_t configdata { { "profile", "default" }, { "file", "caliper.config" } };

        // read pre-init config set to get config file name from env var
        ConfigSetImpl init_config_cfg;
        init_config_cfg.init("config", configdata, m_allow_read_env, m_combined_profile, m_top_profile);

        // read config files
        read_config_files(init_config_cfg.get("file").to_stringlist());

        // merge "default" profile into combined profile
        {
            for (auto& p : m_config_profiles["default"])
                m_combined_profile[p.first] = p.second;
        }

        // read "config" config again: profile may have been set in the file
        std::shared_ptr<ConfigSetImpl> config_cfg { new ConfigSetImpl };
        config_cfg->init("config", configdata, m_allow_read_env, m_combined_profile, m_top_profile);

        m_database.insert(std::make_pair("config", config_cfg));

        // get the selected config profile names
        std::vector<std::string> profile_names = config_cfg->get("profile").to_stringlist();

        // merge all selected profiles
        for (const std::string& profile_name : profile_names) {
            auto it = m_config_profiles.find(profile_name);

            if (it == m_config_profiles.end()) {
                std::cerr << "caliper: error: config profile \"" << profile_name << "\" not defined." << std::endl;
                continue;
            }

            for (auto& p : it->second)
                m_combined_profile[p.first] = p.second;
        }
    }